

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute.h
# Opt level: O1

attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1> *
__thiscall
c74::min::
attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>::
operator=(attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
          *this,double arg)

{
  initializer_list<c74::min::atom> __l;
  atoms as;
  allocator_type local_41;
  vector<c74::min::atom,_std::allocator<c74::min::atom>_> local_40;
  atom local_28;
  
  atom_setfloat(&local_28);
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::vector(&local_40,__l,&local_41);
  (**(this->super_attribute_base)._vptr_attribute_base)(this,&local_40);
  if (local_40.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

attribute& operator=(const T arg)
    {
        atoms as = { atom(arg) };
        *this = as;
        return *this;
    }